

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * __thiscall
chaiscript::json::JSON::dump(string *__return_storage_ptr__,JSON *this,long depth,string *tab)

{
  _Alloc_hider *p_Var1;
  reference this_00;
  bool bVar2;
  Class CVar3;
  add_pointer_t<const_variant_alternative_t<1UL,_variant<std::nullptr_t,_QuickFlatMap<basic_string<char,_char_traits<char>,_allocator<char>_>,_JSON,_equal_to<void>_>,_vector<JSON,_allocator<JSON>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_double,_long,_bool>_>_>
  this_01;
  JSON *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  add_pointer_t<const_variant_alternative_t<2UL,_variant<std::nullptr_t,_QuickFlatMap<basic_string<char,_char_traits<char>,_allocator<char>_>,_JSON,_equal_to<void>_>,_vector<JSON,_allocator<JSON>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_double,_long,_bool>_>_>
  this_03;
  add_pointer_t<const_variant_alternative_t<3UL,_variant<std::nullptr_t,_QuickFlatMap<basic_string<char,_char_traits<char>,_allocator<char>_>,_JSON,_equal_to<void>_>,_vector<JSON,_allocator<JSON>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_double,_long,_bool>_>_>
  str;
  add_pointer_t<const_variant_alternative_t<4UL,_variant<std::nullptr_t,_QuickFlatMap<basic_string<char,_char_traits<char>,_allocator<char>_>,_JSON,_equal_to<void>_>,_vector<JSON,_allocator<JSON>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_double,_long,_bool>_>_>
  ptVar4;
  add_pointer_t<const_variant_alternative_t<5UL,_variant<std::nullptr_t,_QuickFlatMap<basic_string<char,_char_traits<char>,_allocator<char>_>,_JSON,_equal_to<void>_>,_vector<JSON,_allocator<JSON>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_double,_long,_bool>_>_>
  ptVar5;
  add_pointer_t<const_variant_alternative_t<6UL,_variant<std::nullptr_t,_QuickFlatMap<basic_string<char,_char_traits<char>,_allocator<char>_>,_JSON,_equal_to<void>_>,_vector<JSON,_allocator<JSON>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_double,_long,_bool>_>_>
  ptVar6;
  char *__s;
  runtime_error *this_04;
  allocator<char> local_261;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  string local_200;
  reference local_1e0;
  JSON *p_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  type *__range4_1;
  undefined1 local_1b8 [5];
  bool skip_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  string local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  reference local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>
  *p;
  const_iterator __end4;
  const_iterator __begin4;
  type *__range4;
  bool skip;
  long lStack_70;
  long i;
  undefined1 local_60 [8];
  string pad;
  allocator<char> local_29;
  string *local_28;
  string *tab_local;
  long depth_local;
  JSON *this_local;
  string *s;
  
  local_28 = tab;
  tab_local = (string *)depth;
  depth_local = (long)this;
  this_local = (JSON *)__return_storage_ptr__;
  CVar3 = Internal::type(&this->internal);
  switch(CVar3) {
  case Null:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"null",&local_29);
    std::allocator<char>::~allocator(&local_29);
    break;
  case Object:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_60,"",(allocator<char> *)((long)&i + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
    lStack_70 = 0;
    while (lStack_70 < (long)tab_local) {
      lStack_70 = lStack_70 + 1;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,tab);
    }
    __range4._7_1_ = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"{\n",(allocator<char> *)((long)&__range4 + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 6));
    __range4._5_1_ = 1;
    this_01 = Internal::Map_abi_cxx11_(&this->internal);
    __end4 = utility::
             QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>
             ::begin(this_01);
    p = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>
         *)utility::
           QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>
           ::end(this_01);
    while (bVar2 = __gnu_cxx::
                   operator==<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>_>_>_>
                             (&__end4,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>_>_>_>
                                       *)&p), ((bVar2 ^ 0xffU) & 1) != 0) {
      local_98 = __gnu_cxx::
                 __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>_>_>_>
                 ::operator*(&__end4);
      if ((__range4._5_1_ & 1) == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (__return_storage_ptr__,",\n");
      }
      std::operator+(&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     "\"");
      json_escape(&local_138,&local_98->first);
      std::operator+(&local_f8,&local_118,&local_138);
      std::operator+(&local_d8,&local_f8,"\" : ");
      this_02 = &local_98->second;
      p_Var1 = &tab_local->_M_dataplus;
      std::__cxx11::string::string((string *)&local_178,tab);
      dump(&local_158,this_02,(long)((long)&p_Var1->_M_p + 1),&local_178);
      std::operator+(&local_b8,&local_d8,&local_158);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_118);
      __range4._5_1_ = 0;
      __gnu_cxx::
      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON>_>_>_>
      ::operator++(&__end4);
    }
    __rhs = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,0,2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   "\n",__rhs);
    std::operator+(&local_198,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   "}");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)local_1b8);
    __range4._7_1_ = 1;
    std::__cxx11::string::~string((string *)local_60);
    break;
  case Array:
    __range4_1._7_1_ = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[",(allocator<char> *)((long)&__range4_1 + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range4_1 + 6));
    __range4_1._5_1_ = 1;
    this_03 = Internal::Vector(&this->internal);
    __end4_1 = std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>::begin
                         (this_03);
    p_1 = (JSON *)std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>::end
                            (this_03);
    while (bVar2 = __gnu_cxx::
                   operator==<const_chaiscript::json::JSON_*,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>_>
                             (&__end4_1,
                              (__normal_iterator<const_chaiscript::json::JSON_*,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>_>
                               *)&p_1), ((bVar2 ^ 0xffU) & 1) != 0) {
      local_1e0 = __gnu_cxx::
                  __normal_iterator<const_chaiscript::json::JSON_*,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>_>
                  ::operator*(&__end4_1);
      if ((__range4_1._5_1_ & 1) == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (__return_storage_ptr__,", ");
      }
      this_00 = local_1e0;
      p_Var1 = &tab_local->_M_dataplus;
      std::__cxx11::string::string((string *)&local_220,tab);
      dump(&local_200,this_00,(long)((long)&p_Var1->_M_p + 1),&local_220);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (__return_storage_ptr__,&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
      __range4_1._5_1_ = 0;
      __gnu_cxx::
      __normal_iterator<const_chaiscript::json::JSON_*,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>_>
      ::operator++(&__end4_1);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,"]");
    break;
  case String:
    str = Internal::String_abi_cxx11_(&this->internal);
    json_escape(&local_260,str);
    std::operator+(&local_240,"\"",&local_260);
    std::operator+(__return_storage_ptr__,&local_240,"\"");
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    break;
  case Floating:
    ptVar4 = Internal::Float(&this->internal);
    std::__cxx11::to_string(__return_storage_ptr__,*ptVar4);
    break;
  case Integral:
    ptVar5 = Internal::Int(&this->internal);
    std::__cxx11::to_string(__return_storage_ptr__,*ptVar5);
    break;
  case Boolean:
    ptVar6 = Internal::Bool(&this->internal);
    __s = "false";
    if ((*ptVar6 & 1U) != 0) {
      __s = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_261);
    std::allocator<char>::~allocator(&local_261);
    break;
  default:
    this_04 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_04,"Unhandled JSON type");
    __cxa_throw(this_04,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string dump(long depth = 1, std::string tab = "  ") const {
      switch (internal.type()) {
        case Class::Null:
          return "null";
        case Class::Object: {
          std::string pad = "";
          for (long i = 0; i < depth; ++i, pad += tab) {
          }

          std::string s = "{\n";
          bool skip = true;
          for (auto &p : *internal.Map()) {
            if (!skip) {
              s += ",\n";
            }
            s += (pad + "\"" + json_escape(p.first) + "\" : " + p.second.dump(depth + 1, tab));
            skip = false;
          }
          s += ("\n" + pad.erase(0, 2) + "}");
          return s;
        }
        case Class::Array: {
          std::string s = "[";
          bool skip = true;
          for (auto &p : *internal.Vector()) {
            if (!skip) {
              s += ", ";
            }
            s += p.dump(depth + 1, tab);
            skip = false;
          }
          s += "]";
          return s;
        }
        case Class::String:
          return "\"" + json_escape(*internal.String()) + "\"";
        case Class::Floating:
          return std::to_string(*internal.Float());
        case Class::Integral:
          return std::to_string(*internal.Int());
        case Class::Boolean:
          return *internal.Bool() ? "true" : "false";
      }

      throw std::runtime_error("Unhandled JSON type");
    }